

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O1

void __thiscall
Debug::PosixCrashHandler::setup(PosixCrashHandler *this,string *appName,string *crashDirPath)

{
  pointer pcVar1;
  ostream *poVar2;
  string path;
  stringstream s;
  sigaction sa;
  long *local_2a0;
  ulong local_298;
  long local_290 [2];
  undefined1 *local_280 [2];
  long local_270 [5];
  stringstream local_248 [16];
  ostream local_238 [112];
  ios_base local_1c8 [264];
  sigaction local_c0;
  
  local_c0.__sigaction_handler.sa_handler = posixSignalHandler;
  sigemptyset(&local_c0.sa_mask);
  local_c0.sa_flags = 0x8000004;
  sigaction(6,&local_c0,(sigaction *)0x0);
  sigaction(0xb,&local_c0,(sigaction *)0x0);
  sigaction(7,&local_c0,(sigaction *)0x0);
  sigaction(4,&local_c0,(sigaction *)0x0);
  sigaction(8,&local_c0,(sigaction *)0x0);
  sigaction(0xd,&local_c0,(sigaction *)0x0);
  sigaction(0xf,&local_c0,(sigaction *)0x0);
  if (crashDirPath->_M_string_length != 0) {
    pcVar1 = (crashDirPath->_M_dataplus)._M_p;
    local_2a0 = local_290;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar1,pcVar1 + crashDirPath->_M_string_length);
    while ((1 < local_298 && (*(char *)((long)local_2a0 + (local_298 - 1)) == '/'))) {
      local_298 = local_298 - 1;
      *(undefined1 *)((long)local_2a0 + local_298) = 0;
    }
    std::__cxx11::stringstream::stringstream(local_248);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_238,(char *)local_2a0,local_298);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(appName->_M_dataplus)._M_p,appName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_",1);
    now();
    formatDateTime(local_238,(tm *)local_280,"%Y%m%d_%H%M%S");
    std::__ostream_insert<char,std::char_traits<char>>(local_238,".bktr",5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->m_backtraceFilePath,(string *)local_280);
    if ((int *)local_280[0] != &((tm *)local_280)->tm_mon) {
      operator_delete(local_280[0],local_270[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_248);
    std::ios_base::~ios_base(local_1c8);
    if (local_2a0 != local_290) {
      operator_delete(local_2a0,local_290[0] + 1);
    }
  }
  return;
}

Assistant:

void PosixCrashHandler::setup(const std::string &appName, const std::string &crashDirPath) {
        struct sigaction sa;
        sa.sa_sigaction = posixSignalHandler;
        sigemptyset( &sa.sa_mask );

#ifdef __APPLE__
        /* for some reason we backtrace() doesn't work on osx
       when we use an alternate stack */
        sa.sa_flags = SA_SIGINFO;
#else
        sa.sa_flags = SA_SIGINFO | SA_ONSTACK;
#endif

        sigaction( SIGABRT, &sa, NULL );
        sigaction( SIGSEGV, &sa, NULL );
        sigaction( SIGBUS,  &sa, NULL );
        sigaction( SIGILL,  &sa, NULL );
        sigaction( SIGFPE,  &sa, NULL );
        sigaction( SIGPIPE, &sa, NULL );
        sigaction( SIGTERM, &sa, NULL );

        if (!crashDirPath.empty()) {
            std::string path = crashDirPath;
            while ((path.size() > 1) &&
                   (path[path.size() - 1] == '/')) {
                path.erase(path.size() - 1);
            }

            std::stringstream s;
            s << path << "/" << appName << "_";
            formatDateTime(s, now(), CHILLOUT_DATETIME);
            s << ".bktr";
            m_backtraceFilePath = s.str();
        }
    }